

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

ProString * __thiscall
ProString::append(ProString *this,ProStringList *other,bool *pending,bool skipEmpty1st)

{
  undefined8 *puVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  ProString *pPVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  CutResult CVar9;
  byte bVar10;
  longlong lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar16 = (other->super_QList<ProString>).d.size;
  iVar13 = (int)uVar16;
  if (iVar13 == 0) goto LAB_002a2e37;
  if (pending == (bool *)0x0) {
    uVar14 = 0;
    bVar10 = 0;
    if (iVar13 != 1 || this->m_length != 0) goto LAB_002a2cfa;
LAB_002a2cc7:
    pPVar5 = (other->super_QList<ProString>).d.ptr;
    uVar16 = (ulong)(uVar14 * 0x30);
    QString::operator=(&this->m_string,(QString *)((long)&(pPVar5->m_string).d.d + uVar16));
    puVar1 = (undefined8 *)((long)&pPVar5->m_offset + uVar16);
    uVar7 = *puVar1;
    uVar8 = puVar1[1];
    this->m_offset = (int)uVar7;
    this->m_length = (int)((ulong)uVar7 >> 0x20);
    *(undefined8 *)&this->m_file = uVar8;
    this->m_hash = *(size_t *)((long)&pPVar5->m_hash + uVar16);
  }
  else {
    uVar14 = 0;
    if (((skipEmpty1st && *pending == false) &&
        (uVar14 = 0, ((other->super_QList<ProString>).d.ptr)->m_length == 0)) &&
       (uVar14 = 1, iVar13 == 1)) goto LAB_002a2e37;
    if (uVar14 + 1 == iVar13 && this->m_length == 0) goto LAB_002a2cc7;
    bVar10 = (*pending ^ 1U) & this->m_length != 0;
LAB_002a2cfa:
    QString::mid((longlong)&local_58,(longlong)this);
    pQVar2 = &((this->m_string).d.d)->super_QArrayData;
    pcVar3 = (this->m_string).d.ptr;
    (this->m_string).d.d = (Data *)local_58;
    (this->m_string).d.ptr = pcStack_50;
    qVar4 = (this->m_string).d.size;
    (this->m_string).d.size = local_48;
    local_58 = pQVar2;
    pcStack_50 = pcVar3;
    local_48 = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    this->m_offset = 0;
    if ((int)uVar14 < iVar13) {
      lVar12 = (ulong)(uVar14 * 0x30) + 0x1c;
      lVar15 = (uVar16 & 0xffffffff) - (ulong)uVar14;
      do {
        if (bVar10 != 0) {
          QString::append((QChar)(char16_t)this);
        }
        pPVar5 = (other->super_QList<ProString>).d.ptr;
        lVar6 = *(long *)((long)pPVar5 + lVar12 + -0x14);
        local_58 = (QArrayData *)(long)*(int *)((long)pPVar5 + lVar12 + -4);
        local_40 = (long)*(int *)((long)&(pPVar5->m_string).d.d + lVar12);
        CVar9 = QtPrivate::QContainerImplHelper::mid
                          (*(qsizetype *)((long)pPVar5 + lVar12 + -0xc),(qsizetype *)&local_58,
                           &local_40);
        if (CVar9 == Null) {
          lVar11 = 0;
        }
        else {
          lVar11 = (long)local_58 * 2 + lVar6;
        }
        QString::append((QChar *)this,lVar11);
        lVar12 = lVar12 + 0x30;
        bVar10 = 1;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    this->m_length = (int)(this->m_string).d.size;
    iVar13 = (other->super_QList<ProString>).d.ptr[(other->super_QList<ProString>).d.size + -1].
             m_file;
    if (iVar13 != 0) {
      this->m_file = iVar13;
    }
    this->m_hash = 0x80000000;
  }
  if (pending != (bool *)0x0) {
    *pending = true;
  }
LAB_002a2e37:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ProString &ProString::append(const ProStringList &other, bool *pending, bool skipEmpty1st)
{
    if (const int sz = other.size()) {
        int startIdx = 0;
        if (pending && !*pending && skipEmpty1st && other.at(0).isEmpty()) {
            if (sz == 1)
                return *this;
            startIdx = 1;
        }
        if (!m_length && sz == startIdx + 1) {
            *this = other.at(startIdx);
        } else {
            bool putSpace = false;
            if (pending && !*pending && m_length)
                putSpace = true;

            m_string = toQString();
            m_offset = 0;
            for (int i = startIdx; i < sz; ++i) {
                if (putSpace)
                    m_string += QLatin1Char(' ');
                else
                    putSpace = true;
                const ProString &str = other.at(i);
                m_string += str.toQStringView();
            }
            m_length = m_string.size();
            if (other.last().m_file)
                m_file = other.last().m_file;
            m_hash = 0x80000000;
        }
        if (pending)
            *pending = true;
    }
    return *this;
}